

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas.c
# Opt level: O0

int IDASensEwtSet(IDAMem IDA_mem,N_Vector *yScur,N_Vector *weightS)

{
  int iVar1;
  IDAMem in_RDX;
  N_Vector *in_RSI;
  IDAMem in_RDI;
  int flag;
  N_Vector *in_stack_ffffffffffffffd8;
  int iVar2;
  
  iVar2 = 0;
  iVar1 = in_RDI->ida_itolS;
  if (iVar1 == 1) {
    iVar2 = IDASensEwtSetSS(in_RDX,(N_Vector *)0x1,in_stack_ffffffffffffffd8);
  }
  else if (iVar1 == 2) {
    iVar2 = IDASensEwtSetSV(in_RDX,(N_Vector *)0x2,in_stack_ffffffffffffffd8);
  }
  else if (iVar1 == 4) {
    iVar2 = IDASensEwtSetEE(in_RDI,in_RSI,(N_Vector *)in_RDX);
  }
  return iVar2;
}

Assistant:

int IDASensEwtSet(IDAMem IDA_mem, N_Vector* yScur, N_Vector* weightS)
{
  int flag = 0;

  switch (IDA_mem->ida_itolS)
  {
  case IDA_EE: flag = IDASensEwtSetEE(IDA_mem, yScur, weightS); break;
  case IDA_SS: flag = IDASensEwtSetSS(IDA_mem, yScur, weightS); break;
  case IDA_SV: flag = IDASensEwtSetSV(IDA_mem, yScur, weightS); break;
  }

  return (flag);
}